

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O0

void do_consider(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  CHAR_DATA *arg1;
  long in_RDI;
  int diff;
  CHAR_DATA *victim;
  char arg [4608];
  uint in_stack_ffffffffffffedd8;
  undefined4 in_stack_ffffffffffffeddc;
  char *in_stack_ffffffffffffede0;
  char in_stack_ffffffffffffede8;
  uint7 in_stack_ffffffffffffede9;
  char *in_stack_ffffffffffffedf0;
  char *in_stack_ffffffffffffffe0;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  
  one_argument(in_stack_ffffffffffffede0,
               (char *)CONCAT44(in_stack_ffffffffffffeddc,in_stack_ffffffffffffedd8));
  if (in_stack_ffffffffffffede8 == '\0') {
    send_to_char(in_stack_ffffffffffffedf0,(CHAR_DATA *)((ulong)in_stack_ffffffffffffede9 << 8));
  }
  else {
    arg1 = get_char_room(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    if (arg1 == (CHAR_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffedf0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
    }
    else {
      iVar1 = (int)arg1->level - (int)*(short *)(in_RDI + 0x138);
      if (iVar1 < -9) {
        act(in_stack_ffffffffffffedf0,
            (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),arg1,
            (void *)CONCAT44(iVar1,in_stack_ffffffffffffedd8),0);
      }
      else if (iVar1 < -4) {
        act(in_stack_ffffffffffffedf0,
            (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),arg1,
            (void *)CONCAT44(iVar1,in_stack_ffffffffffffedd8),0);
      }
      else if (iVar1 < -1) {
        act(in_stack_ffffffffffffedf0,
            (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),arg1,
            (void *)CONCAT44(iVar1,in_stack_ffffffffffffedd8),0);
      }
      else if (iVar1 < 2) {
        act(in_stack_ffffffffffffedf0,
            (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),arg1,
            (void *)CONCAT44(iVar1,in_stack_ffffffffffffedd8),0);
      }
      else if (iVar1 < 5) {
        act(in_stack_ffffffffffffedf0,
            (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),arg1,
            (void *)CONCAT44(iVar1,in_stack_ffffffffffffedd8),0);
      }
      else if (iVar1 < 10) {
        act(in_stack_ffffffffffffedf0,
            (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),arg1,
            (void *)CONCAT44(iVar1,in_stack_ffffffffffffedd8),0);
      }
      else {
        act(in_stack_ffffffffffffedf0,
            (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),arg1,
            (void *)CONCAT44(iVar1,in_stack_ffffffffffffedd8),0);
      }
      iVar1 = (int)arg1->size - (int)*(short *)(in_RDI + 0x2a0);
      if (iVar1 < 2) {
        if (iVar1 == 1) {
          act(in_stack_ffffffffffffedf0,
              (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),arg1,
              (void *)CONCAT44(1,in_stack_ffffffffffffedd8),0);
        }
        else if (iVar1 == 0) {
          act(in_stack_ffffffffffffedf0,
              (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),arg1,
              (void *)(ulong)in_stack_ffffffffffffedd8,0);
        }
        else if (iVar1 == -1) {
          act(in_stack_ffffffffffffedf0,
              (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),arg1,
              (void *)CONCAT44(0xffffffff,in_stack_ffffffffffffedd8),0);
        }
        else if (iVar1 < -1) {
          act(in_stack_ffffffffffffedf0,
              (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),arg1,
              (void *)CONCAT44(iVar1,in_stack_ffffffffffffedd8),0);
        }
      }
      else {
        act(in_stack_ffffffffffffedf0,
            (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),arg1,
            (void *)CONCAT44(iVar1,in_stack_ffffffffffffedd8),0);
      }
      if (0 < arg1->alignment) {
        act(in_stack_ffffffffffffedf0,
            (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8),arg1,
            (void *)CONCAT44(iVar1,in_stack_ffffffffffffedd8),0);
      }
    }
  }
  return;
}

Assistant:

void do_consider(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	one_argument(argument, arg);
	if (arg[0] == '\0')
	{
		send_to_char("Consider killing whom?\n\r", ch);
		return;
	}

	auto victim = get_char_room(ch, arg);
	if (victim == nullptr)
	{
		send_to_char("They're not here.\n\r", ch);
		return;
	}

	auto diff = victim->level - ch->level;
	if (diff <= -10)
		act("Your sneeze would kill $N.", ch, 0, victim, TO_CHAR);
	else if (diff <= -5)
		act("$N wouldn't last long against you.", ch, 0, victim, TO_CHAR);
	else if (diff <= -2)
		act("$N looks like an easy kill.", ch, 0, victim, TO_CHAR);
	else if (diff <= 1)
		act("$N is about a perfect match for you!", ch, 0, victim, TO_CHAR);
	else if (diff <= 4)
		act("$N looks a little tough.", ch, 0, victim, TO_CHAR);
	else if (diff <= 9)
		act("You wouldn't last too long against $N by yourself.", ch, 0, victim, TO_CHAR);
	else
		act("You must have a fascination with death.", ch, 0, victim, TO_CHAR);

	diff = victim->size - ch->size;
	if (diff > 1)
		act("$N easily towers over you.", ch, 0, victim, TO_CHAR);
	else if (diff == 1)
		act("$N is considerably larger than you.", ch, 0, victim, TO_CHAR);
	else if (!diff)
		act("$N is about the same size as you.", ch, 0, victim, TO_CHAR);
	else if (diff == -1)
		act("$N is considerably smaller than you.", ch, 0, victim, TO_CHAR);
	else if (diff < -1)
		act("You tower over $N.  Be careful not to step on $M.", ch, 0, victim, TO_CHAR);

	if (victim->alignment >= 1)
		act("$N seems relatively benign.", ch, 0, victim, TO_CHAR);
}